

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_string *name_t)

{
  pointer pcVar1;
  uchar uVar2;
  json_string *__lhs;
  JSONNode *orig;
  out_of_range *this_00;
  string *psVar3;
  json_string *in_RDX;
  auto_delete temp;
  allocator local_69;
  json_string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (name_t->_M_dataplus)._M_p;
  std::__cxx11::string::string((string *)&local_68,"no internal",(allocator *)&local_48);
  JSONDebug::_JSON_ASSERT(pcVar1 != (pointer)0x0,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  uVar2 = type((JSONNode *)name_t);
  __lhs = jsonSingletonERROR_NON_ITERATABLE::getValue_abi_cxx11_();
  std::operator+(&local_68,__lhs,"pop_back");
  JSONDebug::_JSON_ASSERT(uVar2 == '\x05',&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  orig = internalJSONNode::pop_back((internalJSONNode *)(name_t->_M_dataplus)._M_p,in_RDX);
  if (orig != (JSONNode *)0x0) {
    JSONNode(this,orig);
    deleteJSONNode(orig);
    return (JSONNode)(internalJSONNode *)this;
  }
  std::__cxx11::string::string
            ((string *)&local_48,"pop_back const could not find child by name: ",&local_69);
  std::operator+(&local_68,&local_48,in_RDX);
  JSONDebug::_JSON_FAIL(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar3);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("pop_back"));
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(name_t);
    #else
	   if (JSONNode * res = internal -> pop_back(name_t)){
		  auto_delete temp(res);
		  return *(temp.mynode);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("pop_back const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    #endif
}